

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void Decode(UINT4 *output,uchar *input,uint len)

{
  uint local_24;
  uint local_20;
  uint j;
  uint i;
  uint len_local;
  uchar *input_local;
  UINT4 *output_local;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < len; local_24 = local_24 + 4) {
    output[local_20] =
         CONCAT13(input[local_24 + 3],
                  CONCAT12(input[local_24 + 2],CONCAT11(input[local_24 + 1],input[local_24])));
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void Decode (UINT4 *output,
                    const unsigned char *input,
                    unsigned int len)
{
  unsigned int i, j;

  for(i = 0, j = 0; j < len; i++, j += 4)
    output[i] = ((UINT4)input[j]) | (((UINT4)input[j+1]) << 8) |
      (((UINT4)input[j+2]) << 16) | (((UINT4)input[j+3]) << 24);
}